

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O0

void If_ManCreateChoice(If_Man_t *p,If_Obj_t *pObj)

{
  uint uVar1;
  If_Obj_t *local_20;
  If_Obj_t *pTemp;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  if ((*(uint *)pObj >> 7 & 1) == 0) {
    *(uint *)pObj = *(uint *)pObj & 0xffffff7f | 0x80;
    for (local_20 = pObj; local_20 != (If_Obj_t *)0x0; local_20 = local_20->pEquiv) {
      if (*(uint *)local_20 >> 0xd < *(uint *)pObj >> 0xd) {
        uVar1 = *(uint *)pObj;
      }
      else {
        uVar1 = *(uint *)local_20;
      }
      *(uint *)pObj = *(uint *)pObj & 0x1fff | uVar1 & 0xffffe000;
      local_20->nVisits = local_20->nVisits + 1;
      local_20->nVisitsCopy = local_20->nVisitsCopy + 1;
    }
    if (p->nLevelMax < (int)(*(uint *)pObj >> 0xd)) {
      p->nLevelMax = *(uint *)pObj >> 0xd;
    }
    p->nChoices = p->nChoices + 1;
    return;
  }
  __assert_fail("pObj->fRepr == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMan.c"
                ,0x1ce,"void If_ManCreateChoice(If_Man_t *, If_Obj_t *)");
}

Assistant:

void If_ManCreateChoice( If_Man_t * p, If_Obj_t * pObj )
{
    If_Obj_t * pTemp;
    // mark the node as a representative if its class
    assert( pObj->fRepr == 0 );
    pObj->fRepr = 1;
    // update the level of this node (needed for correct required time computation)
    for ( pTemp = pObj; pTemp; pTemp = pTemp->pEquiv )
    {
        pObj->Level = IF_MAX( pObj->Level, pTemp->Level );
        pTemp->nVisits++; pTemp->nVisitsCopy++;
    }
    // mark the largest level
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    p->nChoices++;
}